

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::PickerPrivate::drawTick(PickerPrivate *this,QRect *r,QPainter *p)

{
  QPen *pQVar1;
  QPen pen;
  
  QPainter::save();
  QPainter::setRenderHint((RenderHint)p,true);
  pQVar1 = (QPen *)QPainter::pen();
  QPen::QPen(&pen,pQVar1);
  QPen::setWidth((int)&pen);
  QPen::setCapStyle((PenCapStyle)&pen);
  QPainter::setPen((QPen *)p);
  QPainter::setViewport((QRect *)p);
  QPainter::setWindow(p,0,0,6,7);
  QPainter::drawLine(p,0,4,2,6);
  QPainter::drawLine(p,2,6,5,1);
  QPainter::restore();
  QPen::~QPen(&pen);
  return;
}

Assistant:

void
PickerPrivate::drawTick( const QRect & r, QPainter * p )
{
	p->save();

	p->setRenderHint( QPainter::Antialiasing );

	QPen pen = p->pen();
	pen.setWidth( 2 );
	pen.setCapStyle( Qt::RoundCap );
	p->setPen( pen );

	p->setViewport( r );
	p->setWindow( 0, 0, 6, 7 );
	p->drawLine( 0, 4, 2, 6 );
	p->drawLine( 2, 6, 5, 1 );

	p->restore();
}